

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_context.c
# Opt level: O0

void destroyContextGLX(_GLFWwindow *window)

{
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x270) != 0) {
    (*_glfw.glx.DestroyWindow)(_glfw.x11.display,*(GLXWindow *)(in_RDI + 0x270));
    *(undefined8 *)(in_RDI + 0x270) = 0;
  }
  if (*(long *)(in_RDI + 0x268) != 0) {
    (*_glfw.glx.DestroyContext)(_glfw.x11.display,*(GLXContext *)(in_RDI + 0x268));
    *(undefined8 *)(in_RDI + 0x268) = 0;
  }
  return;
}

Assistant:

static void destroyContextGLX(_GLFWwindow* window)
{
    if (window->context.glx.window)
    {
        glXDestroyWindow(_glfw.x11.display, window->context.glx.window);
        window->context.glx.window = None;
    }

    if (window->context.glx.handle)
    {
        glXDestroyContext(_glfw.x11.display, window->context.glx.handle);
        window->context.glx.handle = NULL;
    }
}